

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::logBlendState(TestLog *log,BlendState *blend)

{
  ostringstream *poVar1;
  bool *pbVar2;
  Vector<bool,_4> *pVVar3;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar4;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar5;
  int i;
  long lVar6;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *blendEq;
  BVec4 mask;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pbVar2 = (blend->enableBlend).m_ptr;
  local_1a8._0_8_ = log;
  if (pbVar2 != (bool *)0x0) {
    if (*pbVar2 == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 8),"Enable blending.",0x10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 8),"Disable blending.",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
    std::ios_base::~ios_base(local_130);
  }
  pVVar3 = (blend->colorMask).m_ptr;
  if (pVVar3 != (Vector<bool,_4> *)0x0) {
    lVar6 = 0;
    do {
      *(bool *)((long)&local_1c8.m_getName + lVar6) = pVVar3->m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Set color mask: ",0x10);
    tcu::operator<<((ostream *)poVar1,(Vector<bool,_4> *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  pEVar4 = (blend->blendEq).m_ptr;
  if (pEVar4 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    if (pEVar4->m_isFirst == true) {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Set blend equation: ",0x14);
      local_1c8.m_value = *(pEVar4->field_1).m_first;
      local_1c8.m_getName = glu::getBlendEquationName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Set blend equation rgb: ",0x18);
      local_1c8.m_value = *(pEVar4->field_1).m_first;
      local_1c8.m_getName = glu::getBlendEquationName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", alpha: ",9);
      local_1b8.m_value = ((pEVar4->field_1).m_second)->alpha;
      local_1b8.m_getName = glu::getBlendEquationName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
    std::ios_base::~ios_base(local_130);
  }
  pEVar5 = (blend->blendFunc).m_ptr;
  if (pEVar5 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    if (pEVar5->m_isFirst == true) {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Set blend function source: ",0x1b);
      local_1c8.m_value = ((pEVar5->field_1).m_first)->src;
      local_1c8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", destination: ",0xf);
      local_1b8.m_value = ((pEVar5->field_1).m_first)->dst;
      local_1b8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Set blend function rgb source: ",0x1f);
      local_1c8.m_value = ((pEVar5->field_1).m_first)->src;
      local_1c8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", destination: ",0xf);
      local_1b8.m_value = ((pEVar5->field_1).m_first)->dst;
      local_1b8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Set blend function alpha source: ",0x21);
      local_1c8.m_value = (((pEVar5->field_1).m_second)->alpha).src;
      local_1c8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", destination: ",0xf);
      local_1b8.m_value = (((pEVar5->field_1).m_second)->alpha).dst;
      local_1b8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void logBlendState (TestLog&			log,
					const BlendState&	blend)
{
	if (blend.enableBlend)
	{
		if (*blend.enableBlend)
			log << TestLog::Message << "Enable blending." << TestLog::EndMessage;
		else
			log << TestLog::Message << "Disable blending." << TestLog::EndMessage;
	}

	if (blend.colorMask)
	{
		const BVec4 mask = *blend.colorMask;

		log << TestLog::Message << "Set color mask: " << mask << "." << TestLog::EndMessage;
	}

	if (blend.blendEq)
	{
		const Either<BlendEq, SeparateBlendEq>& blendEq = *blend.blendEq;

		if (blendEq.is<BlendEq>())
			log << TestLog::Message << "Set blend equation: " << glu::getBlendEquationStr(blendEq.get<BlendEq>()) << "." << TestLog::EndMessage;
		else if (blendEq.is<SeparateBlendEq>())
			log << TestLog::Message << "Set blend equation rgb: " << glu::getBlendEquationStr(blendEq.get<SeparateBlendEq>().rgb) << ", alpha: " << glu::getBlendEquationStr(blendEq.get<SeparateBlendEq>().alpha) << "." << TestLog::EndMessage;
		else
			DE_ASSERT(false);
	}

	if (blend.blendFunc)
	{
		const Either<BlendFunc, SeparateBlendFunc>& blendFunc = *blend.blendFunc;

		if (blendFunc.is<BlendFunc>())
			log << TestLog::Message << "Set blend function source: " << glu::getBlendFactorStr(blendFunc.get<BlendFunc>().src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<BlendFunc>().dst) << "." << TestLog::EndMessage;
		else if (blendFunc.is<SeparateBlendFunc>())
		{
			log << TestLog::Message << "Set blend function rgb source: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().rgb.src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().rgb.dst) << "." << TestLog::EndMessage;
			log << TestLog::Message << "Set blend function alpha source: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().alpha.src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().alpha.dst) << "." << TestLog::EndMessage;
		}
		else
			DE_ASSERT(false);
	}
}